

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall Js::FunctionBody::BeginExecution(FunctionBody *this)

{
  FunctionBody *this_local;
  
  this->m_DEBUG_executionCount = this->m_DEBUG_executionCount + 1;
  LockDownCounters(this);
  InterlockedIncrement<unsigned_int>(&this->m_depth);
  return;
}

Assistant:

void
    FunctionBody::BeginExecution()
    {
#if DBG
        m_DEBUG_executionCount++;
        this->LockDownCounters();
#endif
        // Don't allow loop headers to be released while the function is executing
        ::InterlockedIncrement(&this->m_depth);
    }